

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O2

bool absl::lts_20250127::str_format_internal::anon_unknown_0::FallbackToSnprintf<long_double>
               (longdouble v,FormatConversionSpecImpl *conv,FormatSinkImpl *sink)

{
  char *pcVar1;
  size_type sVar2;
  char cVar3;
  uint uVar4;
  FormatConversionSpecImpl *in_RDX;
  uint uVar5;
  undefined8 in_R9;
  ulong uVar6;
  string_view v_00;
  string space;
  char fmt [32];
  
  uVar5 = 0;
  if (0 < conv->width_) {
    uVar5 = conv->width_;
  }
  uVar6 = 0xffffffff;
  if (-1 < conv->precision_) {
    uVar6 = (ulong)(uint)conv->precision_;
  }
  fmt[0] = '%';
  FormatConversionSpecImplFriend::FlagsToString_abi_cxx11_
            (&space,(FormatConversionSpecImplFriend *)conv,in_RDX);
  sVar2 = space._M_string_length;
  memcpy(fmt + 1,space._M_dataplus._M_p,space._M_string_length);
  std::__cxx11::string::~string((string *)&space);
  pcVar1 = fmt + sVar2 + 1;
  pcVar1[0] = '*';
  pcVar1[1] = '.';
  pcVar1[2] = '*';
  pcVar1[3] = 'L';
  cVar3 = FormatConversionCharToChar(conv->conv_);
  fmt[sVar2 + 5] = cVar3;
  fmt[sVar2 + 6] = '\0';
  if (0x19 < (long)sVar2) {
    __assert_fail("fp < fmt + sizeof(fmt)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/str_format/float_conversion.cc"
                  ,0x3d2,
                  "bool absl::str_format_internal::(anonymous namespace)::FallbackToSnprintf(const Float, const FormatConversionSpecImpl &, FormatSinkImpl *) [Float = long double]"
                 );
  }
  space._M_dataplus._M_p = (pointer)&space.field_2;
  std::__cxx11::string::_M_construct((ulong)&space,'\0');
  do {
    uVar4 = snprintf(space._M_dataplus._M_p,space._M_string_length,fmt,(ulong)uVar5,uVar6,in_R9,v);
    if ((int)uVar4 < 0) {
LAB_0030cfb0:
      std::__cxx11::string::~string((string *)&space);
      return -1 < (int)uVar4;
    }
    v_00._M_len = (ulong)uVar4;
    if (v_00._M_len < space._M_string_length) {
      v_00._M_str = space._M_dataplus._M_p;
      FormatSinkImpl::Append(sink,v_00);
      goto LAB_0030cfb0;
    }
    std::__cxx11::string::resize((ulong)&space);
  } while( true );
}

Assistant:

bool FallbackToSnprintf(const Float v, const FormatConversionSpecImpl &conv,
                        FormatSinkImpl *sink) {
  int w = conv.width() >= 0 ? conv.width() : 0;
  int p = conv.precision() >= 0 ? conv.precision() : -1;
  char fmt[32];
  {
    char *fp = fmt;
    *fp++ = '%';
    fp = CopyStringTo(FormatConversionSpecImplFriend::FlagsToString(conv), fp);
    fp = CopyStringTo("*.*", fp);
    if (std::is_same<long double, Float>()) {
      *fp++ = 'L';
    }
    *fp++ = FormatConversionCharToChar(conv.conversion_char());
    *fp = 0;
    assert(fp < fmt + sizeof(fmt));
  }
  std::string space(512, '\0');
  absl::string_view result;
  while (true) {
    int n = snprintf(&space[0], space.size(), fmt, w, p, v);
    if (n < 0) return false;
    if (static_cast<size_t>(n) < space.size()) {
      result = absl::string_view(space.data(), static_cast<size_t>(n));
      break;
    }
    space.resize(static_cast<size_t>(n) + 1);
  }
  sink->Append(result);
  return true;
}